

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::to_string_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this,double d)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  double d_local;
  Decompiler *this_local;
  string *s;
  
  std::__cxx11::to_string(__return_storage_ptr__,d);
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    bVar3 = false;
    if (2 < uVar1) {
      pcVar2 = (char *)std::__cxx11::string::back();
      bVar3 = false;
      if (*pcVar2 == '0') {
        std::__cxx11::string::size();
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        bVar3 = *pcVar2 != '.';
      }
    }
    if (!bVar3) break;
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(double d) {
    auto s = std::to_string(d);
    // Remove redundant trailing '0's that to_string produces.
    while (s.size() > 2 && s.back() == '0' && s[s.size() - 2] != '.')
      s.pop_back();
    return s;
  }